

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t add_owner_name(archive_match *a,match_list *list,wchar_t mbs,void *name)

{
  wchar_t wVar1;
  match *m;
  
  m = (match *)calloc(1,0x78);
  if (m == (match *)0x0) {
    error_nomem(a);
    wVar1 = L'\xffffffe2';
  }
  else {
    if (mbs == L'\0') {
      archive_mstring_copy_wcs(&m->pattern,(wchar_t *)name);
    }
    else {
      archive_mstring_copy_mbs(&m->pattern,(char *)name);
    }
    match_list_add(list,m);
    *(byte *)&a->setflag = (byte)a->setflag | 4;
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
add_owner_name(struct archive_match *a, struct match_list *list,
    int mbs, const void *name)
{
	struct match *match;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	if (mbs)
		archive_mstring_copy_mbs(&(match->pattern), name);
	else
		archive_mstring_copy_wcs(&(match->pattern), name);
	match_list_add(list, match);
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}